

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O2

void __thiscall MipsGenerator::GenerateStore(MipsGenerator *this,string *temp_name,string *type)

{
  int __val;
  bool bVar1;
  mapped_type *pmVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  allocator local_163;
  allocator local_162;
  allocator local_161;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = std::operator==(type,"t");
  if (bVar1) {
    __val = this->m_relative_addr;
    pmVar2 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->m_temp2address,temp_name);
    *pmVar2 = __val;
    std::__cxx11::string::string((string *)&local_120,"sw ",&local_162);
    std::__cxx11::string::string((string *)&local_140,"$25",&local_163);
    std::operator+(&local_100,&local_120,&local_140);
    std::operator+(&local_e0,&local_100," -");
    std::__cxx11::to_string(&local_160,__val);
    std::operator+(&local_c0,&local_e0,&local_160);
    std::__cxx11::string::string((string *)&local_a0,"($sp)",&local_161);
    std::operator+(&local_40,&local_c0,&local_a0);
    Output2File(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    this->m_relative_addr = this->m_relative_addr + 4;
  }
  else {
    bVar1 = std::operator==(type,"g");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_120,"sw ",(allocator *)&local_a0);
      std::__cxx11::string::string((string *)&local_140,"$25",&local_162);
      std::operator+(&local_100,&local_120,&local_140);
      std::operator+(&local_e0,&local_100," ");
      std::operator+(&local_c0,&local_e0,temp_name);
      std::__cxx11::string::string((string *)&local_160,"($28)",&local_163);
      std::operator+(&local_60,&local_c0,&local_160);
      str = &local_60;
    }
    else {
      std::__cxx11::string::string((string *)&local_120,"sw ",(allocator *)&local_a0);
      std::__cxx11::string::string((string *)&local_140,"$25",&local_162);
      std::operator+(&local_100,&local_120,&local_140);
      std::operator+(&local_e0,&local_100," -");
      std::operator+(&local_c0,&local_e0,temp_name);
      std::__cxx11::string::string((string *)&local_160,"($fp)",&local_163);
      std::operator+(&local_80,&local_c0,&local_160);
      str = &local_80;
    }
    Output2File(this,str);
    std::__cxx11::string::~string((string *)str);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
  }
  return;
}

Assistant:

void MipsGenerator::GenerateStore(string temp_name, string type) {
    if (type == TMP) {
        int store_offset = m_relative_addr;
        m_temp2address[temp_name] = store_offset;
        Output2File(string("sw ") + NUM1 + " -" + std::to_string(store_offset) + string("($sp)"));
        m_relative_addr += 4;
    } else if (type == GLOBAL) {
        Output2File(string("sw ") + NUM1 + " " + temp_name + string("($28)"));
    } else {
        Output2File(string("sw ") + NUM1 + " -" + temp_name + string("($fp)"));
    }
}